

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O0

void __thiscall
glslang::TIntermediate::addBlockStorageOverride
          (TIntermediate *this,char *nameStr,TBlockStorageClass backing)

{
  undefined4 uVar1;
  mapped_type *pmVar2;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string name;
  TBlockStorageClass backing_local;
  char *nameStr_local;
  TIntermediate *this_local;
  
  name.field_2._12_4_ = backing;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,nameStr,&local_41);
  std::allocator<char>::~allocator(&local_41);
  uVar1 = name.field_2._12_4_;
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass>_>_>
           ::operator[](&this->blockBackingOverrides,(key_type *)local_40);
  *pmVar2 = uVar1;
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void addBlockStorageOverride(const char* nameStr, TBlockStorageClass backing)
    {
        std::string name(nameStr);
        blockBackingOverrides[name] = backing;
    }